

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O1

void __thiscall
agge::layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
          (layout *this,long *text,undefined8 *param_3)

{
  positioned_glyph *ppVar1;
  long *plVar2;
  byte *pbVar3;
  float fVar4;
  byte bVar5;
  positioned_glyph *ppVar6;
  positioned_glyph *ppVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pointer ptVar11;
  byte *pbVar12;
  uint uVar13;
  positioned_glyph *ppVar14;
  long lVar15;
  long *plVar16;
  ulong uVar17;
  glyph *pgVar18;
  byte *pbVar19;
  pointer ptVar20;
  uint uVar21;
  positioned_glyph *ppVar23;
  long lVar24;
  pointer ptVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  byte *pbVar29;
  byte *pbVar30;
  float fVar31;
  ptr font_;
  layout_builder builder;
  shared_ptr<agge::font> local_78;
  layout_builder local_68;
  int iVar22;
  
  uVar17 = text[1];
  uVar26 = (uint)uVar17;
  ppVar6 = (this->_glyphs)._begin;
  iVar22 = (int)((ulong)((long)(this->_glyphs)._limit - (long)ppVar6) >> 2);
  uVar21 = iVar22 * -0x55555555;
  uVar13 = uVar26 + iVar22 * 0x55555555;
  if (uVar21 <= uVar26 && uVar13 != 0) {
    ppVar7 = (this->_glyphs)._end;
    uVar26 = uVar21 >> 1;
    if (uVar21 < uVar13 * 2) {
      uVar26 = uVar13;
    }
    uVar28 = (ulong)(uVar26 + uVar21 + (uint)(uVar26 == 0));
    ppVar14 = (positioned_glyph *)operator_new__(uVar28 * 0xc);
    ppVar23 = ppVar14;
    for (ppVar1 = ppVar6; ppVar1 != ppVar7; ppVar1 = ppVar1 + 1) {
      (ppVar23->d).dy = (ppVar1->d).dy;
      fVar31 = (ppVar1->d).dx;
      ppVar23->index = ppVar1->index;
      (ppVar23->d).dx = fVar31;
      ppVar23 = ppVar23 + 1;
    }
    if (ppVar6 != (positioned_glyph *)0x0) {
      operator_delete__(ppVar6);
    }
    (this->_glyphs)._begin = ppVar14;
    (this->_glyphs)._end =
         ppVar14 + (uint)((int)((ulong)((long)ppVar7 - (long)ppVar6) >> 2) * -0x55555555);
    (this->_glyphs)._limit = ppVar14 + uVar28;
  }
  plVar2 = text + 1;
  (this->_glyphs)._end = (this->_glyphs)._begin + (uVar17 & 0xffffffff);
  (this->_box).w = 0.0;
  (this->_box).h = 0.0;
  layout_builder::layout_builder(&local_68,&this->_glyphs,&this->_glyph_runs,&this->_text_lines);
  lVar8 = text[4];
  lVar9 = text[5];
  if (lVar9 == lVar8) {
    lVar15 = *plVar2;
    lVar27 = lVar8;
    lVar24 = lVar15;
  }
  else {
    if (lVar8 + 0x38 == lVar9) {
      lVar15 = *plVar2;
    }
    else {
      lVar15 = *(long *)(lVar8 + 0x68);
    }
    lVar27 = lVar8 + 0x38;
    lVar24 = 0;
  }
  lVar10 = *plVar2;
  do {
    if ((lVar24 == lVar10) && (lVar15 == lVar10)) {
      layout_builder::break_current_line(&local_68);
      ptVar11 = (this->_text_lines).
                super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar25 = (this->_text_lines).
                super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
      (this->_text_lines).super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_finish = ptVar25;
      if (ptVar11 != ptVar25) {
        fVar31 = (this->_box).w;
        do {
          ptVar20 = ptVar11;
          fVar4 = ptVar20->extent;
          if (fVar31 < fVar4) {
            (this->_box).w = fVar4;
            fVar31 = fVar4;
          }
          ptVar11 = ptVar20 + 1;
        } while (ptVar20 + 1 != ptVar25);
        (this->_box).h = (ptVar20->offset).dy + ptVar20->descent;
      }
      return;
    }
    (**(code **)*param_3)(&local_78,param_3,lVar8);
    layout_builder::begin_style(&local_68,&local_78);
    if (lVar24 != lVar15) {
      pbVar3 = (byte *)(*text + lVar15);
      pbVar29 = (byte *)(lVar24 + *text);
      do {
        uVar17 = (ulong)(*pbVar29 == 10);
        pbVar30 = pbVar29 + uVar17;
        if (*pbVar29 == 10) {
          layout_builder::break_current_line(&local_68);
          pbVar29 = pbVar30;
        }
        else {
          bVar5 = *pbVar30;
          uVar26 = (uint)bVar5;
          pbVar30 = pbVar30 + 1;
          pbVar19 = pbVar30;
          if ((char)bVar5 < '\0') {
            pbVar12 = pbVar30;
            if (0xbf < bVar5) {
              if (bVar5 < 0xe0) {
                lVar24 = 1;
                uVar26 = 0x1f;
              }
              else if (bVar5 < 0xf0) {
                lVar24 = 2;
                uVar26 = 0xf;
              }
              else {
                if (0xf7 < bVar5) goto LAB_0014fd0e;
                lVar24 = 3;
                uVar26 = 7;
              }
              pbVar12 = pbVar3;
              if (lVar24 <= (long)pbVar3 - (long)pbVar30) {
                uVar26 = bVar5 & uVar26;
                pbVar19 = pbVar29 + uVar17 + lVar24 + 1;
                do {
                  pbVar12 = pbVar30;
                  if ((*pbVar30 & 0xffffffc0) != 0x80) goto LAB_0014fd0e;
                  uVar26 = *pbVar30 & 0x3f | uVar26 << 6;
                  pbVar30 = pbVar30 + 1;
                  lVar24 = lVar24 + -1;
                } while (lVar24 != 0);
                goto LAB_0014fd13;
              }
            }
LAB_0014fd0e:
            pbVar19 = pbVar12;
            uVar26 = 0xfffd;
          }
LAB_0014fd13:
          if ((0x7f < uVar26) ||
             (pgVar18 = (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->_ansi_glyphs[uVar26], pgVar18 == (glyph *)0x0)) {
            pgVar18 = font::get_glyph_for_codepoint_slow
                                (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,uVar26);
          }
          fVar31 = (pgVar18->metrics).advance_x;
          uVar17 = (ulong)local_68._state.next;
          local_68._state.next = local_68._state.next + 1;
          ppVar6 = (local_68._glyphs)->_begin;
          ppVar6[uVar17].index = pgVar18->index;
          ppVar6[uVar17].d.dx = fVar31;
          ppVar6[uVar17].d.dy = 0.0;
          local_68._state.extent = fVar31 + local_68._state.extent;
          pbVar29 = pbVar19;
        }
      } while (pbVar29 != pbVar3);
    }
    if (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    lVar24 = lVar15;
    if (lVar9 != lVar27) {
      plVar16 = (long *)(lVar27 + 0x68);
      if (lVar9 == lVar27 + 0x38) {
        plVar16 = plVar2;
      }
      lVar8 = lVar27;
      lVar15 = *plVar16;
      lVar27 = lVar27 + 0x38;
    }
  } while( true );
}

Assistant:

inline void layout::process(const richtext_t &text, LimiterT limiter, FontFactoryT &font_factory_)
	{
		_glyphs.resize(static_cast<count_t>(text.size()));
		_box = zero();

		layout_builder builder(_glyphs, _glyph_runs, _text_lines);

		for (richtext_t::const_iterator range = text.ranges_begin(), ranges_end = text.ranges_end(); range != ranges_end;
			++range)
		{
			const font::ptr font_ = font_factory_.create_font(range->get_annotation().basic);

			builder.begin_style(font_);
			limiter.begin_style(static_cast<const layout_builder &>(builder));
			for (std::string::const_iterator i = range->begin(), end = range->end(); i != end; )
			{
				if (eat_lf(i))
				{
					builder.break_current_line();
					limiter.new_line();
					continue;
				}

				std::string::const_iterator next = i;
				const glyph &g = *font_->get_glyph_for_codepoint(utfia::utf8::next(next, end));

				if (!limiter.add_glyph(builder, g.index, g.metrics.advance_x, i, next, end))
				{
					_text_lines.clear();
					return;
				}
			}
		}
		builder.break_current_line();
		_text_lines.pop_back();
		for (text_lines_container_t::const_iterator i = _text_lines.begin(); i != _text_lines.end(); ++i)
		{
			if (i->extent > _box.w)
				_box.w = i->extent;
			_box.h = i->offset.dy + i->descent;
		}
	}